

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompilationcontext.cpp
# Opt level: O3

bool SQCompilation::SQCompilationContext::loadConfigFile(char *configFile)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  KeyValueFile config;
  KeyValueFile local_60;
  
  paVar1 = &local_60.fileName.field_2;
  local_60.printErrorFunc = (PrintErrorFunc)0x0;
  local_60.fileName._M_string_length = 0;
  local_60.fileName.field_2._M_local_buf[0] = '\0';
  local_60.kv.
  super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.kv.
  super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_60.kv.
  super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
  _M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_60.kv.
  super__Vector_base<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_60._60_8_ = 0;
  local_60.fileName._M_dataplus._M_p = (pointer)paVar1;
  bVar2 = KeyValueFile::loadFromFile(&local_60,configFile);
  if (bVar2) {
    loadConfigFile(&local_60);
  }
  std::vector<KeyValueFile::StringKeyValue,_std::allocator<KeyValueFile::StringKeyValue>_>::~vector
            (&local_60.kv);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_60.fileName._M_dataplus._M_p,
                    CONCAT71(local_60.fileName.field_2._M_allocated_capacity._1_7_,
                             local_60.fileName.field_2._M_local_buf[0]) + 1);
  }
  return bVar2;
}

Assistant:

bool SQCompilationContext::loadConfigFile(const char *configFile) {
  KeyValueFile config;
  if (!config.loadFromFile(configFile)) {
    return false;
  }

  return loadConfigFile(config);
}